

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerHLSL::read_access_chain
          (CompilerHLSL *this,string *expr,string *lhs,SPIRAccessChain *chain)

{
  uint32_t *puVar1;
  pointer pcVar2;
  CompilerHLSL *pCVar3;
  bool bVar4;
  SPIRType *type;
  long *plVar5;
  runtime_error *prVar6;
  size_type *psVar7;
  char (*in_R8) [2];
  string *in_R9;
  uint uVar8;
  uint uVar9;
  char (*pacVar10) [2];
  SPIRType *pSVar11;
  char *load_op_1;
  size_type local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  char *load_op;
  CompilerHLSL *local_390;
  string load_expr;
  undefined1 *local_368 [2];
  undefined1 local_358 [20];
  uint local_344;
  string template_expr;
  string base;
  SPIRType scalar_type;
  SPIRType target_type;
  
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.ptr +
                    *(uint *)&(chain->super_IVariant).field_0xc);
  local_390 = this;
  bVar4 = Compiler::is_scalar((Compiler *)this,type);
  pCVar3 = local_390;
  target_type.super_IVariant._12_4_ = 0x15;
  if (!bVar4) {
    target_type.super_IVariant._12_4_ = *(undefined4 *)&(type->super_IVariant).field_0xc;
  }
  target_type.array.super_VectorView<unsigned_int>.ptr = (uint *)&target_type.array.stack_storage;
  target_type.super_IVariant.self.id = 0;
  target_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_0049ded8;
  target_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
  target_type.array.buffer_capacity = 8;
  target_type.array_size_literal.super_VectorView<bool>.ptr =
       (bool *)&target_type.array_size_literal.stack_storage;
  target_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
  target_type.array_size_literal.buffer_capacity = 8;
  target_type.pointer_depth = 0;
  target_type.pointer = false;
  target_type.forward_pointer = false;
  target_type.cooperative.use_id = 0;
  target_type.cooperative.rows_id = 0;
  target_type.cooperative.columns_id = 0;
  target_type.cooperative.scope_id = 0;
  target_type.storage = Generic;
  target_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr =
       (TypedID<(spirv_cross::Types)1> *)&target_type.member_types.stack_storage;
  target_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
  buffer_size = 0;
  target_type.member_types.buffer_capacity = 8;
  target_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr =
       (uint *)&target_type.member_type_index_redirection.stack_storage;
  target_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
  target_type.member_type_index_redirection.buffer_capacity = 8;
  target_type.member_name_cache._M_h._M_buckets =
       &target_type.member_name_cache._M_h._M_single_bucket;
  target_type.image._0_7_ = 0;
  target_type.image._7_4_ = 0;
  target_type.image.sampled = 0;
  target_type.image.format = ImageFormatUnknown;
  target_type.image.access = AccessQualifierReadOnly;
  target_type.type_alias.id = 0;
  target_type.parent_type.id = 0;
  target_type.member_name_cache._M_h._M_bucket_count = 1;
  target_type.member_name_cache._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  target_type.member_name_cache._M_h._M_element_count = 0;
  target_type.member_name_cache._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  target_type.member_name_cache._M_h._M_rehash_policy._M_next_resize = 0;
  target_type.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)0x0;
  target_type.basetype = UInt;
  target_type.width = 0;
  target_type.vecsize = type->vecsize;
  target_type.columns = type->columns;
  if ((type->array).super_VectorView<unsigned_int>.buffer_size != 0) {
    read_access_chain_array(local_390,lhs,chain);
    goto LAB_001e1cdc;
  }
  if (type->basetype == Struct) {
    read_access_chain_struct(local_390,lhs,chain);
    goto LAB_001e1cdc;
  }
  if ((type->width != 0x20) && ((local_390->hlsl_options).enable_16bit_types == false)) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (prVar6,
               "Reading types other than 32-bit from ByteAddressBuffer not yet supported, unless SM 6.2 and native 16-bit types are enabled."
              );
    *(undefined ***)prVar6 = &PTR__runtime_error_0049deb0;
    __cxa_throw(prVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  base._M_dataplus._M_p = (pointer)&base.field_2;
  pcVar2 = (chain->base)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&base,pcVar2,pcVar2 + (chain->base)._M_string_length);
  pacVar10 = (char (*) [2])0x1e1069;
  bVar4 = Compiler::has_decoration
                    ((Compiler *)pCVar3,(ID)(chain->super_IVariant).self.id,DecorationNonUniform);
  if (bVar4) {
    pacVar10 = (char (*) [2])0x1e1081;
    CompilerGLSL::convert_non_uniform_expression
              (&pCVar3->super_CompilerGLSL,&base,(chain->super_IVariant).self.id);
  }
  uVar9 = (pCVar3->hlsl_options).shader_model;
  load_expr._M_dataplus._M_p = (pointer)&load_expr.field_2;
  load_expr._M_string_length = 0;
  load_expr.field_2._M_local_buf[0] = '\0';
  template_expr._M_dataplus._M_p = (pointer)&template_expr.field_2;
  template_expr._M_string_length = 0;
  template_expr.field_2._M_local_buf[0] = '\0';
  if (0x3d < uVar9) {
    (*(pCVar3->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&load_op_1,pCVar3,type,0);
    join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              ((string *)&scalar_type,(spirv_cross *)0x361f9d,(char (*) [2])&load_op_1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a3c7f,in_R8);
    pacVar10 = (char (*) [2])0x1e1108;
    ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&scalar_type);
    if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.basetype) {
      pacVar10 = (char (*) [2])0x1e111d;
      operator_delete(scalar_type.super_IVariant._vptr_IVariant);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)load_op_1 != &local_3a8) {
      pacVar10 = (char (*) [2])0x1e1130;
      operator_delete(load_op_1);
    }
  }
  local_344 = uVar9;
  if (type->columns == 1) {
    if (chain->row_major_matrix == false) {
      load_op_1 = (char *)0x0;
      switch(type->vecsize) {
      case 1:
        load_op_1 = "Load";
        break;
      case 2:
        load_op_1 = "Load2";
        break;
      case 3:
        load_op_1 = "Load3";
        break;
      case 4:
        load_op_1 = "Load4";
        break;
      default:
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error(prVar6,"Unknown vector size.");
        *(undefined ***)prVar6 = &PTR__runtime_error_0049deb0;
        __cxa_throw(prVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (0x3d < uVar9) {
        load_op_1 = "Load";
      }
      in_R9 = (string *)0x3a67d9;
      join<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,int_const&,char_const(&)[2]>
                ((string *)&scalar_type,(spirv_cross *)&base,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35dc3b,
                 (char (*) [2])&load_op_1,(char **)&template_expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a67d9,
                 (char (*) [2])&chain->dynamic_index,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &chain->static_index,(int *)0x3b224b,pacVar10);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
      if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.basetype) {
        operator_delete(scalar_type.super_IVariant._vptr_IVariant);
      }
    }
    else {
      if (uVar9 < 0x3e) {
        pSVar11 = type;
        if (1 < type->vecsize) {
          (*(local_390->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&scalar_type,local_390,&target_type,0);
          ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
          if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.basetype) {
            operator_delete(scalar_type.super_IVariant._vptr_IVariant);
          }
          ::std::__cxx11::string::append((char *)&load_expr);
        }
      }
      else {
        SPIRType::SPIRType(&scalar_type,type);
        scalar_type.vecsize = 1;
        scalar_type.columns = 1;
        (*(pCVar3->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_368,pCVar3,&scalar_type,0);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  ((string *)&load_op_1,(spirv_cross *)0x361f9d,(char (*) [2])local_368,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a3c7f,
                   in_R8);
        ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&load_op_1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)load_op_1 != &local_3a8) {
          operator_delete(load_op_1);
        }
        if (local_368[0] != local_358) {
          operator_delete(local_368[0]);
        }
        if (1 < type->vecsize) {
          (*(pCVar3->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_368,pCVar3,type,0);
          plVar5 = (long *)::std::__cxx11::string::append((char *)local_368);
          psVar7 = (size_type *)(plVar5 + 2);
          if ((size_type *)*plVar5 == psVar7) {
            local_3a8._M_allocated_capacity = *psVar7;
            local_3a8._8_8_ = plVar5[3];
            load_op_1 = (char *)&local_3a8;
          }
          else {
            local_3a8._M_allocated_capacity = *psVar7;
            load_op_1 = (char *)*plVar5;
          }
          local_3b0 = plVar5[1];
          *plVar5 = (long)psVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)&load_expr,(ulong)load_op_1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)load_op_1 != &local_3a8) {
            operator_delete(load_op_1);
          }
          if (local_368[0] != local_358) {
            operator_delete(local_368[0]);
          }
        }
        scalar_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_0049ded8;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&scalar_type.member_name_cache._M_h);
        scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)
            scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
            &scalar_type.member_type_index_redirection.stack_storage) {
          free(scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
        }
        scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
        buffer_size = 0;
        pSVar11 = type;
        if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
            scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            ptr != &scalar_type.member_types.stack_storage) {
          free(scalar_type.member_types.
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
        }
        scalar_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
        if ((AlignedBuffer<bool,_8UL> *)scalar_type.array_size_literal.super_VectorView<bool>.ptr !=
            &scalar_type.array_size_literal.stack_storage) {
          free(scalar_type.array_size_literal.super_VectorView<bool>.ptr);
        }
        scalar_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)scalar_type.array.super_VectorView<unsigned_int>.ptr
            != &scalar_type.array.stack_storage) {
          free(scalar_type.array.super_VectorView<unsigned_int>.ptr);
        }
      }
      if (type->vecsize != 0) {
        uVar9 = 0;
        type = pSVar11;
        do {
          load_op_1 = (char *)CONCAT44(load_op_1._4_4_,
                                       chain->matrix_stride * uVar9 + chain->static_index);
          in_R9 = &chain->dynamic_index;
          join<std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                    ((string *)&scalar_type,(spirv_cross *)&base,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".Load",
                     (char (*) [6])&template_expr,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a67d9,
                     (char (*) [2])&chain->dynamic_index,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&load_op_1
                     ,(uint *)0x3b224b,(char (*) [2])type);
          ::std::__cxx11::string::_M_append
                    ((char *)&load_expr,(ulong)scalar_type.super_IVariant._vptr_IVariant);
          if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.basetype) {
            operator_delete(scalar_type.super_IVariant._vptr_IVariant);
          }
          uVar9 = uVar9 + 1;
          if (uVar9 < type->vecsize) {
            ::std::__cxx11::string::append((char *)&load_expr);
          }
        } while (uVar9 < type->vecsize);
        if (1 < type->vecsize) goto LAB_001e15a8;
      }
    }
  }
  else if (chain->row_major_matrix == false) {
    load_op = (char *)0x0;
    switch(type->vecsize) {
    case 1:
      load_op = "Load";
      break;
    case 2:
      load_op = "Load2";
      break;
    case 3:
      load_op = "Load3";
      break;
    case 4:
      load_op = "Load4";
      break;
    default:
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(prVar6,"Unknown vector size.");
      *(undefined ***)prVar6 = &PTR__runtime_error_0049deb0;
      __cxa_throw(prVar6,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (uVar9 < 0x3e) {
      (*(pCVar3->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&scalar_type,pCVar3,&target_type,0);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
      pSVar11 = type;
      if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.basetype) {
        operator_delete(scalar_type.super_IVariant._vptr_IVariant);
      }
    }
    else {
      SPIRType::SPIRType(&scalar_type,type);
      scalar_type.columns = 1;
      (*(pCVar3->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (local_368,pCVar3,&scalar_type,0);
      join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                ((string *)&load_op_1,(spirv_cross *)0x361f9d,(char (*) [2])local_368,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a3c7f,in_R8
                );
      ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&load_op_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)load_op_1 != &local_3a8) {
        operator_delete(load_op_1);
      }
      if (local_368[0] != local_358) {
        operator_delete(local_368[0]);
      }
      pSVar11 = type;
      (*(pCVar3->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&load_op_1,pCVar3,type,0);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&load_op_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)load_op_1 != &local_3a8) {
        operator_delete(load_op_1);
      }
      load_op = "Load";
      scalar_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_0049ded8;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&scalar_type.member_name_cache._M_h);
      scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
      if ((AlignedBuffer<unsigned_int,_8UL> *)
          scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
          &scalar_type.member_type_index_redirection.stack_storage) {
        free(scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
      }
      scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
      buffer_size = 0;
      if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
          scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          ptr != &scalar_type.member_types.stack_storage) {
        free(scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
             .ptr);
      }
      scalar_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
      if ((AlignedBuffer<bool,_8UL> *)scalar_type.array_size_literal.super_VectorView<bool>.ptr !=
          &scalar_type.array_size_literal.stack_storage) {
        free(scalar_type.array_size_literal.super_VectorView<bool>.ptr);
      }
      scalar_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
      if ((AlignedBuffer<unsigned_int,_8UL> *)scalar_type.array.super_VectorView<unsigned_int>.ptr
          != &scalar_type.array.stack_storage) {
        free(scalar_type.array.super_VectorView<unsigned_int>.ptr);
      }
    }
    pacVar10 = (char (*) [2])0x1e17a5;
    ::std::__cxx11::string::append((char *)&load_expr);
    puVar1 = &type->columns;
    type = pSVar11;
    if (*puVar1 != 0) {
      uVar9 = 0;
      do {
        load_op_1 = (char *)CONCAT44(load_op_1._4_4_,
                                     chain->matrix_stride * uVar9 + chain->static_index);
        in_R9 = (string *)0x3a67d9;
        join<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                  ((string *)&scalar_type,(spirv_cross *)&base,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35dc3b,
                   (char (*) [2])&load_op,(char **)&template_expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a67d9,
                   (char (*) [2])&chain->dynamic_index,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&load_op_1,
                   (uint *)0x3b224b,pacVar10);
        pacVar10 = (char (*) [2])0x1e183d;
        ::std::__cxx11::string::_M_append
                  ((char *)&load_expr,(ulong)scalar_type.super_IVariant._vptr_IVariant);
        if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.basetype) {
          pacVar10 = (char (*) [2])0x1e1857;
          operator_delete(scalar_type.super_IVariant._vptr_IVariant);
        }
        uVar9 = uVar9 + 1;
        if (uVar9 < type->columns) {
          pacVar10 = (char (*) [2])0x1e1873;
          ::std::__cxx11::string::append((char *)&load_expr);
        }
      } while (uVar9 < type->columns);
    }
    ::std::__cxx11::string::append((char *)&load_expr);
  }
  else {
    if (uVar9 < 0x3e) {
      (*(pCVar3->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&scalar_type,pCVar3,&target_type,0);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
      pSVar11 = type;
      if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.basetype) {
        operator_delete(scalar_type.super_IVariant._vptr_IVariant);
      }
    }
    else {
      (*(pCVar3->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&scalar_type,pCVar3,type,0);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
      if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.basetype) {
        operator_delete(scalar_type.super_IVariant._vptr_IVariant);
      }
      SPIRType::SPIRType(&scalar_type,type);
      scalar_type.vecsize = 1;
      scalar_type.columns = 1;
      (*(pCVar3->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (local_368,pCVar3,&scalar_type,0);
      join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                ((string *)&load_op_1,(spirv_cross *)0x361f9d,(char (*) [2])local_368,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a3c7f,in_R8
                );
      pSVar11 = type;
      ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&load_op_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)load_op_1 != &local_3a8) {
        operator_delete(load_op_1);
      }
      if (local_368[0] != local_358) {
        operator_delete(local_368[0]);
      }
      scalar_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_0049ded8;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&scalar_type.member_name_cache._M_h);
      scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
      if ((AlignedBuffer<unsigned_int,_8UL> *)
          scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
          &scalar_type.member_type_index_redirection.stack_storage) {
        free(scalar_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
      }
      scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
      buffer_size = 0;
      if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
          scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          ptr != &scalar_type.member_types.stack_storage) {
        free(scalar_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
             .ptr);
      }
      scalar_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
      if ((AlignedBuffer<bool,_8UL> *)scalar_type.array_size_literal.super_VectorView<bool>.ptr !=
          &scalar_type.array_size_literal.stack_storage) {
        free(scalar_type.array_size_literal.super_VectorView<bool>.ptr);
      }
      scalar_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
      if ((AlignedBuffer<unsigned_int,_8UL> *)scalar_type.array.super_VectorView<unsigned_int>.ptr
          != &scalar_type.array.stack_storage) {
        free(scalar_type.array.super_VectorView<unsigned_int>.ptr);
      }
    }
    ::std::__cxx11::string::append((char *)&load_expr);
    if (type->columns != 0) {
      uVar9 = 0;
      do {
        if (type->vecsize != 0) {
          uVar8 = 0;
          do {
            load_op_1 = (char *)CONCAT44(load_op_1._4_4_,
                                         chain->matrix_stride * uVar8 +
                                         (type->width >> 3) * uVar9 + chain->static_index);
            in_R9 = &chain->dynamic_index;
            join<std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                      ((string *)&scalar_type,(spirv_cross *)&base,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".Load",
                       (char (*) [6])&template_expr,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a67d9
                       ,(char (*) [2])&chain->dynamic_index,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &load_op_1,(uint *)0x3b224b,(char (*) [2])pSVar11);
            ::std::__cxx11::string::_M_append
                      ((char *)&load_expr,(ulong)scalar_type.super_IVariant._vptr_IVariant);
            type = pSVar11;
            if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.basetype) {
              operator_delete(scalar_type.super_IVariant._vptr_IVariant);
              type = pSVar11;
            }
            uVar8 = uVar8 + 1;
            pSVar11 = type;
            if ((uVar8 < type->vecsize) || (uVar9 + 1 < type->columns)) {
              ::std::__cxx11::string::append((char *)&load_expr);
            }
          } while (uVar8 < type->vecsize);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < type->columns);
    }
LAB_001e15a8:
    ::std::__cxx11::string::append((char *)&load_expr);
  }
  pCVar3 = local_390;
  if (local_344 < 0x3e) {
    (*(local_390->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3c])
              (&scalar_type,local_390,type,&target_type);
    if (scalar_type.super_IVariant._8_8_ != 0) {
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                ((string *)&load_op_1,(spirv_cross *)&scalar_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a67d9,
                 (char (*) [2])&load_expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b224b,
                 (char (*) [2])in_R9);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&load_op_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)load_op_1 != &local_3a8) {
        operator_delete(load_op_1);
      }
    }
    if (scalar_type.super_IVariant._vptr_IVariant != (_func_int **)&scalar_type.basetype) {
      operator_delete(scalar_type.super_IVariant._vptr_IVariant);
    }
  }
  if (lhs->_M_string_length == 0) {
    if (expr == (string *)0x0) {
      __assert_fail("expr",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_hlsl.cpp"
                    ,0x12a1,
                    "void spirv_cross::CompilerHLSL::read_access_chain(string *, const string &, const SPIRAccessChain &)"
                   );
    }
    ::std::__cxx11::string::operator=((string *)expr,(string *)&load_expr);
  }
  else {
    CompilerGLSL::
    statement<std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
              (&pCVar3->super_CompilerGLSL,lhs,(char (*) [4])0x3a613c,&load_expr,
               (char (*) [2])0x3a5fd0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)template_expr._M_dataplus._M_p != &template_expr.field_2) {
    operator_delete(template_expr._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)load_expr._M_dataplus._M_p != &load_expr.field_2) {
    operator_delete(load_expr._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)base._M_dataplus._M_p != &base.field_2) {
    operator_delete(base._M_dataplus._M_p);
  }
LAB_001e1cdc:
  target_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_0049ded8;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&target_type.member_name_cache._M_h);
  target_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)
      target_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
      &target_type.member_type_index_redirection.stack_storage) {
    free(target_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
  }
  target_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
  buffer_size = 0;
  if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
      target_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr !=
      &target_type.member_types.stack_storage) {
    free(target_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
        );
  }
  target_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
  if ((AlignedBuffer<bool,_8UL> *)target_type.array_size_literal.super_VectorView<bool>.ptr !=
      &target_type.array_size_literal.stack_storage) {
    free(target_type.array_size_literal.super_VectorView<bool>.ptr);
  }
  target_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)target_type.array.super_VectorView<unsigned_int>.ptr !=
      &target_type.array.stack_storage) {
    free(target_type.array.super_VectorView<unsigned_int>.ptr);
  }
  return;
}

Assistant:

void CompilerHLSL::read_access_chain(string *expr, const string &lhs, const SPIRAccessChain &chain)
{
	auto &type = get<SPIRType>(chain.basetype);

	SPIRType target_type { is_scalar(type) ? OpTypeInt : type.op };
	target_type.basetype = SPIRType::UInt;
	target_type.vecsize = type.vecsize;
	target_type.columns = type.columns;

	if (!type.array.empty())
	{
		read_access_chain_array(lhs, chain);
		return;
	}
	else if (type.basetype == SPIRType::Struct)
	{
		read_access_chain_struct(lhs, chain);
		return;
	}
	else if (type.width != 32 && !hlsl_options.enable_16bit_types)
		SPIRV_CROSS_THROW("Reading types other than 32-bit from ByteAddressBuffer not yet supported, unless SM 6.2 and "
		                  "native 16-bit types are enabled.");

	string base = chain.base;
	if (has_decoration(chain.self, DecorationNonUniform))
		convert_non_uniform_expression(base, chain.self);

	bool templated_load = hlsl_options.shader_model >= 62;
	string load_expr;

	string template_expr;
	if (templated_load)
		template_expr = join("<", type_to_glsl(type), ">");

	// Load a vector or scalar.
	if (type.columns == 1 && !chain.row_major_matrix)
	{
		const char *load_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			load_op = "Load";
			break;
		case 2:
			load_op = "Load2";
			break;
		case 3:
			load_op = "Load3";
			break;
		case 4:
			load_op = "Load4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		if (templated_load)
			load_op = "Load";

		load_expr = join(base, ".", load_op, template_expr, "(", chain.dynamic_index, chain.static_index, ")");
	}
	else if (type.columns == 1)
	{
		// Strided load since we are loading a column from a row-major matrix.
		if (templated_load)
		{
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
			if (type.vecsize > 1)
				load_expr += type_to_glsl(type) + "(";
		}
		else if (type.vecsize > 1)
		{
			load_expr = type_to_glsl(target_type);
			load_expr += "(";
		}

		for (uint32_t r = 0; r < type.vecsize; r++)
		{
			load_expr += join(base, ".Load", template_expr, "(", chain.dynamic_index,
			                  chain.static_index + r * chain.matrix_stride, ")");
			if (r + 1 < type.vecsize)
				load_expr += ", ";
		}

		if (type.vecsize > 1)
			load_expr += ")";
	}
	else if (!chain.row_major_matrix)
	{
		// Load a matrix, column-major, the easy case.
		const char *load_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			load_op = "Load";
			break;
		case 2:
			load_op = "Load2";
			break;
		case 3:
			load_op = "Load3";
			break;
		case 4:
			load_op = "Load4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		if (templated_load)
		{
			auto vector_type = type;
			vector_type.columns = 1;
			template_expr = join("<", type_to_glsl(vector_type), ">");
			load_expr = type_to_glsl(type);
			load_op = "Load";
		}
		else
		{
			// Note, this loading style in HLSL is *actually* row-major, but we always treat matrices as transposed in this backend,
			// so row-major is technically column-major ...
			load_expr = type_to_glsl(target_type);
		}
		load_expr += "(";

		for (uint32_t c = 0; c < type.columns; c++)
		{
			load_expr += join(base, ".", load_op, template_expr, "(", chain.dynamic_index,
			                  chain.static_index + c * chain.matrix_stride, ")");
			if (c + 1 < type.columns)
				load_expr += ", ";
		}
		load_expr += ")";
	}
	else
	{
		// Pick out elements one by one ... Hopefully compilers are smart enough to recognize this pattern
		// considering HLSL is "row-major decl", but "column-major" memory layout (basically implicit transpose model, ugh) ...

		if (templated_load)
		{
			load_expr = type_to_glsl(type);
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
		}
		else
			load_expr = type_to_glsl(target_type);

		load_expr += "(";

		for (uint32_t c = 0; c < type.columns; c++)
		{
			for (uint32_t r = 0; r < type.vecsize; r++)
			{
				load_expr += join(base, ".Load", template_expr, "(", chain.dynamic_index,
				                  chain.static_index + c * (type.width / 8) + r * chain.matrix_stride, ")");

				if ((r + 1 < type.vecsize) || (c + 1 < type.columns))
					load_expr += ", ";
			}
		}
		load_expr += ")";
	}

	if (!templated_load)
	{
		auto bitcast_op = bitcast_glsl_op(type, target_type);
		if (!bitcast_op.empty())
			load_expr = join(bitcast_op, "(", load_expr, ")");
	}

	if (lhs.empty())
	{
		assert(expr);
		*expr = std::move(load_expr);
	}
	else
		statement(lhs, " = ", load_expr, ";");
}